

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.hpp
# Opt level: O0

void ixy::info<ixy::Pair<ixy::Pair<ixy::None,char_const*>,std::__cxx11::string_const&>>
               (char *file,int line,char *function,
               LogData<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
               *data)

{
  ostream *poVar1;
  LogData<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
  *data_local;
  char *function_local;
  int line_local;
  char *file_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"[INFO ] ");
  poVar1 = std::operator<<(poVar1,file);
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,line);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,function);
  std::operator<<(poVar1,"(): ");
  printList<ixy::Pair<ixy::None,char_const*>,std::__cxx11::string_const&>
            ((ostream *)&std::cout,&data->list);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void info(const char *file, int line, const char *function, const LogData<List> &data) {
    std::cout << "[INFO ] " << file << ":" << line << " " << function << "(): ";
    printList(std::cout, data.list);
    std::cout << std::endl;
}